

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontMatrix<float,_TPZStackEqnStorage<float>,_TPZFrontNonSym<float>_>::~TPZFrontMatrix
          (TPZFrontMatrix<float,_TPZStackEqnStorage<float>,_TPZFrontNonSym<float>_> *this,void **vtt
          )

{
  TPZVec<int> *in_RSI;
  undefined8 *in_RDI;
  void **in_stack_ffffffffffffffd8;
  
  *in_RDI = in_RSI->_vptr_TPZVec;
  TPZVec<int>::~TPZVec(in_RSI);
  TPZVec<int>::~TPZVec(in_RSI);
  TPZFrontNonSym<float>::~TPZFrontNonSym((TPZFrontNonSym<float> *)0x1cd5b66);
  TPZStackEqnStorage<float>::~TPZStackEqnStorage((TPZStackEqnStorage<float> *)0x1cd5b74);
  TPZAbstractFrontMatrix<float>::~TPZAbstractFrontMatrix
            ((TPZAbstractFrontMatrix<float> *)in_RSI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

TPZFrontMatrix<TVar,store, front>::~TPZFrontMatrix(){
}